

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# costas.cc
# Opt level: O2

void __thiscall Costas::work(Costas *this,size_t nsamples,complex<float> *fi,complex<float> *fo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t j_1;
  size_t j;
  long lVar3;
  size_t i;
  ulong uVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  complex<float> sincos [4];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48 [6];
  
  for (uVar4 = 0; uVar4 < nsamples; uVar4 = uVar4 + 4) {
    uVar1 = this->phase_;
    uVar2 = this->freq_;
    local_48[0] = -((float)uVar2 * 0.0 + (float)uVar1);
    local_48[1] = -((float)uVar1 + (float)uVar2);
    local_48[2] = -((float)uVar2 * 2.0 + (float)uVar1);
    local_48[3] = -((float)uVar2 * 3.0 + (float)uVar1);
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar6 = local_48[lVar3];
      fVar5 = cosf(fVar6);
      *(float *)(&local_68 + lVar3) = fVar5;
      fVar6 = sinf(fVar6);
      *(float *)((long)&local_68 + lVar3 * 8 + 4) = fVar6;
    }
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
      std::operator*((complex<float> *)((long)&fi->_M_value + lVar3),
                     (complex<float> *)((long)&local_68 + lVar3));
      *(ulong *)((long)&fo->_M_value + lVar3) = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    fVar6 = 0.0;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar5 = *(float *)&fo[lVar3]._M_value * *(float *)((long)&fo[lVar3]._M_value + 4);
      fVar6 = fVar6 + (ABS(fVar5 + 1.0) - ABS(fVar5 + -1.0)) * 0.5 * 0.25;
    }
    fVar5 = this->beta_ * fVar6 + this->freq_;
    fVar6 = fVar6 * this->alpha_ + fVar5 + this->phase_;
    this->phase_ = fVar6;
    this->freq_ = (ABS(fVar5 + this->maxDeviation_) - ABS(fVar5 - this->maxDeviation_)) * 0.5;
    if (6.2831855 <= ABS(fVar6) && ABS(fVar6) != 6.2831855) {
      this->phase_ = (fVar6 * 0.15915494 - (float)(int)(fVar6 * 0.15915494)) * 6.2831855;
    }
    fi = fi + 4;
    fo = fo + 4;
  }
  return;
}

Assistant:

void Costas::work(
    size_t nsamples,
    std::complex<float>* fi,
    std::complex<float>* fo) {
  for (size_t i = 0; i < nsamples; i += 4) {
    float phase[4] = {
      -(phase_ + 0 * freq_),
      -(phase_ + 1 * freq_),
      -(phase_ + 2 * freq_),
      -(phase_ + 3 * freq_),
    };

    // Compute sin/cos for phase offset
    std::complex<float> sincos[4];
    for (size_t j = 0; j < 4; j++) {
      sincos[j].real(cosf(phase[j]));
      sincos[j].imag(sinf(phase[j]));
    }

    // Complex multiplication
    for (size_t j = 0; j < 4; j++) {
      fo[i + j] = fi[i + j] * sincos[j];
    }

    // Phase detector is executed for all samples,
    // Clip resulting value to [-1.0f, 1.0f].
    // Total error is average of 4 errors.
    float terr = 0.0f;
    for (size_t j = 0; j < 4; j++) {
      float err = fo[i + j].real() * fo[i + j].imag();
      terr += (0.5f * (fabsf(err + 1.0f) - fabsf(err - 1.0f))) / 4.0f;
    }

    // Update frequency and phase
    freq_ += beta_ * terr;
    phase_ += alpha_ * terr + freq_;

    // Clamp frequency
    freq_ = (0.5f * (fabsf(freq_ + maxDeviation_) -
                     fabsf(freq_ - maxDeviation_)));

    // Wrap phase if needed
    if (phase_ > M_2PI || phase_ < -M_2PI) {
      float frac = phase_ * (1.0 / M_2PI);
      phase_ = (frac - (float)((int)frac)) * M_2PI;
    }
  }
}